

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibString.cpp
# Opt level: O0

int lib::string::Sub(State *state)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  State *in_RDI;
  double dVar5;
  int i;
  string sub;
  int params;
  int end;
  int start;
  char *c_str;
  int size;
  String *str;
  StackAPI api;
  int local_84;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  ValueT in_stack_ffffffffffffff88;
  ValueT in_stack_ffffffffffffff8c;
  ValueT in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  StackAPI *in_stack_ffffffffffffff98;
  int local_40;
  int local_3c;
  char *local_38;
  int local_2c;
  String *local_28;
  StackAPI local_20;
  int local_4;
  
  luna::StackAPI::StackAPI(&local_20,in_RDI);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT,luna::ValueT,luna::ValueT>
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
                     in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  if (bVar1) {
    local_28 = luna::StackAPI::GetString
                         ((StackAPI *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                          in_stack_ffffffffffffff84);
    sVar3 = luna::String::GetLength(local_28);
    local_2c = (int)sVar3;
    local_38 = luna::String::GetCStr(local_28);
    dVar5 = luna::StackAPI::GetNumber
                      ((StackAPI *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       in_stack_ffffffffffffff84);
    local_3c = (int)dVar5;
    local_40 = local_2c;
    iVar2 = luna::StackAPI::GetStackSize
                      ((StackAPI *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    if (iVar2 < 3) {
      if (local_3c == 0) {
        local_3c = 1;
      }
      else if (local_3c < 0) {
        if (local_2c + local_3c < 0) {
          local_3c = 1;
        }
        else {
          local_3c = local_2c + local_3c + 1;
        }
      }
    }
    else {
      if (local_3c == 0) {
        local_84 = 1;
      }
      else {
        local_84 = local_3c;
        if (local_3c < 1) {
          local_84 = -local_3c;
        }
      }
      local_3c = local_84;
      dVar5 = luna::StackAPI::GetNumber
                        ((StackAPI *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         in_stack_ffffffffffffff84);
      local_40 = (int)dVar5;
      if (local_40 < 1) {
        local_40 = -local_40;
      }
      piVar4 = std::min<int>(&local_40,&local_2c);
      local_40 = *piVar4;
    }
    std::__cxx11::string::string((string *)&stack0xffffffffffffff98);
    for (iVar2 = local_3c; iVar2 <= local_40; iVar2 = iVar2 + 1) {
      std::__cxx11::string::push_back((char)&stack0xffffffffffffff98);
    }
    luna::StackAPI::PushString
              ((StackAPI *)CONCAT44(iVar2,in_stack_ffffffffffffff90),
               (string *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    local_4 = 1;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Sub(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(2, luna::ValueT_String,
                           luna::ValueT_Number, luna::ValueT_Number))
            return 0;

        auto str = api.GetString(0);
        int size = str->GetLength();
        auto c_str = str->GetCStr();
        auto start = static_cast<int>(api.GetNumber(1));
        auto end = size;

        auto params = api.GetStackSize();
        if (params <= 2)
        {
            if (start == 0)
            {
                start = 1;
            }
            else if (start < 0)
            {
                start += size;
                start = start < 0 ? 1 : start + 1;
            }
        }
        else
        {
            start = start == 0 ? 1 : std::abs(start);
            end = std::abs(static_cast<int>(api.GetNumber(2)));
            end = std::min(end, size);
        }

        std::string sub;
        for (int i = start; i <= end; ++i)
            sub.push_back(c_str[i - 1]);

        api.PushString(sub);
        return 1;
    }